

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

ImageT<unsigned_short,_2U> * __thiscall
ImageT<unsigned_short,_2U>::normalize(ImageT<unsigned_short,_2U> *this)

{
  uint32_t uVar1;
  ImageT<unsigned_short,_2U> *in_RDI;
  Color *c;
  uint32_t i;
  uint32_t pixelCount;
  uint uVar2;
  
  uVar1 = Image::getPixelCount(&in_RDI->super_Image);
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    color<unsigned_short,_2U>::normalize((color<unsigned_short,_2U> *)CONCAT44(uVar1,uVar2));
  }
  return in_RDI;
}

Assistant:

virtual ImageT& normalize() override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            c.normalize();
        }
        return *this;
    }